

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * __thiscall kwssys::RegExpCompile::regatom(RegExpCompile *this,int *flagp)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  uint *in_RSI;
  RegExpCompile *in_RDI;
  bool bVar7;
  char ender;
  int len;
  int rxpclassend;
  int rxpclass;
  int flags;
  char *ret;
  int local_30;
  uint local_28;
  uint local_24;
  char *local_20;
  RegExpCompile *in_stack_fffffffffffffff8;
  
  *in_RSI = 0;
  pcVar6 = in_RDI->regparse;
  in_RDI->regparse = pcVar6 + 1;
  cVar1 = *pcVar6;
  iVar3 = (int)cVar1;
  if (cVar1 != '\0') {
    if (iVar3 == 0x24) {
      pcVar6 = regnode(in_RDI,'\x02');
      return pcVar6;
    }
    if (iVar3 == 0x28) {
      pcVar6 = reg(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20),(int *)in_RSI);
      if (pcVar6 != (char *)0x0) {
        *in_RSI = local_24 & 5 | *in_RSI;
        return pcVar6;
      }
      return (char *)0x0;
    }
    if (iVar3 != 0x29) {
      if (1 < iVar3 - 0x2aU) {
        if (iVar3 == 0x2e) {
          pcVar6 = regnode(in_RDI,'\x03');
          *in_RSI = *in_RSI | 3;
          return pcVar6;
        }
        if (iVar3 != 0x3f) {
          if (iVar3 == 0x5b) {
            if (*in_RDI->regparse == '^') {
              local_20 = regnode(in_RDI,'\x05');
              in_RDI->regparse = in_RDI->regparse + 1;
            }
            else {
              local_20 = regnode(in_RDI,'\x04');
            }
            if ((*in_RDI->regparse == ']') || (*in_RDI->regparse == '-')) {
              pcVar6 = in_RDI->regparse;
              in_RDI->regparse = pcVar6 + 1;
              regc(in_RDI,*pcVar6);
            }
            while( true ) {
              bVar7 = false;
              if (*in_RDI->regparse != '\0') {
                bVar7 = *in_RDI->regparse != ']';
              }
              if (!bVar7) break;
              if (*in_RDI->regparse == '-') {
                in_RDI->regparse = in_RDI->regparse + 1;
                if ((*in_RDI->regparse == ']') || (*in_RDI->regparse == '\0')) {
                  regc(in_RDI,'-');
                }
                else {
                  local_28 = (byte)in_RDI->regparse[-2] + 1;
                  bVar2 = *in_RDI->regparse;
                  if (bVar2 + 1 < local_28) {
                    printf("RegularExpression::compile(): Invalid range in [].\n");
                    return (char *)0x0;
                  }
                  for (; (int)local_28 <= (int)(uint)bVar2; local_28 = local_28 + 1) {
                    regc(in_RDI,(char)local_28);
                  }
                  in_RDI->regparse = in_RDI->regparse + 1;
                }
              }
              else {
                pcVar6 = in_RDI->regparse;
                in_RDI->regparse = pcVar6 + 1;
                regc(in_RDI,*pcVar6);
              }
            }
            regc(in_RDI,'\0');
            if (*in_RDI->regparse == ']') {
              in_RDI->regparse = in_RDI->regparse + 1;
              *in_RSI = *in_RSI | 3;
              return local_20;
            }
            printf("RegularExpression::compile(): Unmatched [].\n");
            return (char *)0x0;
          }
          if (iVar3 == 0x5c) {
            if (*in_RDI->regparse != '\0') {
              pcVar4 = regnode(in_RDI,'\b');
              pcVar6 = in_RDI->regparse;
              in_RDI->regparse = pcVar6 + 1;
              regc(in_RDI,*pcVar6);
              regc(in_RDI,'\0');
              *in_RSI = *in_RSI | 3;
              return pcVar4;
            }
            printf("RegularExpression::compile(): Trailing backslash.\n");
            return (char *)0x0;
          }
          if (iVar3 == 0x5e) {
            pcVar6 = regnode(in_RDI,'\x01');
            return pcVar6;
          }
          if (iVar3 != 0x7c) {
            in_RDI->regparse = in_RDI->regparse + -1;
            sVar5 = strcspn(in_RDI->regparse,"^$.[()|?+*\\");
            local_30 = (int)sVar5;
            if (0 < local_30) {
              cVar1 = in_RDI->regparse[local_30];
              if ((1 < local_30) && (((cVar1 == '*' || (cVar1 == '+')) || (cVar1 == '?')))) {
                local_30 = local_30 + -1;
              }
              *in_RSI = *in_RSI | 1;
              if (local_30 == 1) {
                *in_RSI = *in_RSI | 2;
              }
              pcVar6 = regnode(in_RDI,'\b');
              for (; 0 < local_30; local_30 = local_30 + -1) {
                pcVar4 = in_RDI->regparse;
                in_RDI->regparse = pcVar4 + 1;
                regc(in_RDI,*pcVar4);
              }
              regc(in_RDI,'\0');
              return pcVar6;
            }
            printf("RegularExpression::compile(): Internal error.\n");
            return (char *)0x0;
          }
          goto LAB_001c714b;
        }
      }
      printf("RegularExpression::compile(): ?+* follows nothing.\n");
      return (char *)0x0;
    }
  }
LAB_001c714b:
  printf("RegularExpression::compile(): Internal error.\n");
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::regatom(int* flagp)
{
  char* ret;
  int flags;

  *flagp = WORST; // Tentatively.

  switch (*regparse++) {
    case '^':
      ret = regnode(BOL);
      break;
    case '$':
      ret = regnode(EOL);
      break;
    case '.':
      ret = regnode(ANY);
      *flagp |= HASWIDTH | SIMPLE;
      break;
    case '[': {
      int rxpclass;
      int rxpclassend;

      if (*regparse == '^') { // Complement of range.
        ret = regnode(ANYBUT);
        regparse++;
      } else
        ret = regnode(ANYOF);
      if (*regparse == ']' || *regparse == '-')
        regc(*regparse++);
      while (*regparse != '\0' && *regparse != ']') {
        if (*regparse == '-') {
          regparse++;
          if (*regparse == ']' || *regparse == '\0')
            regc('-');
          else {
            rxpclass = UCHARAT(regparse - 2) + 1;
            rxpclassend = UCHARAT(regparse);
            if (rxpclass > rxpclassend + 1) {
              // RAISE Error, SYM(RegularExpression), SYM(Invalid_Range),
              printf("RegularExpression::compile(): Invalid range in [].\n");
              return nullptr;
            }
            for (; rxpclass <= rxpclassend; rxpclass++)
              regc(static_cast<char>(rxpclass));
            regparse++;
          }
        } else
          regc(*regparse++);
      }
      regc('\0');
      if (*regparse != ']') {
        // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Bracket),
        printf("RegularExpression::compile(): Unmatched [].\n");
        return nullptr;
      }
      regparse++;
      *flagp |= HASWIDTH | SIMPLE;
    } break;
    case '(':
      ret = reg(1, &flags);
      if (ret == nullptr)
        return (nullptr);
      *flagp |= flags & (HASWIDTH | SPSTART);
      break;
    case '\0':
    case '|':
    case ')':
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n"); // Never here
      return nullptr;
    case '?':
    case '+':
    case '*':
      // RAISE Error, SYM(RegularExpression), SYM(No_Operand),
      printf("RegularExpression::compile(): ?+* follows nothing.\n");
      return nullptr;
    case '\\':
      if (*regparse == '\0') {
        // RAISE Error, SYM(RegularExpression), SYM(Trailing_Backslash),
        printf("RegularExpression::compile(): Trailing backslash.\n");
        return nullptr;
      }
      ret = regnode(EXACTLY);
      regc(*regparse++);
      regc('\0');
      *flagp |= HASWIDTH | SIMPLE;
      break;
    default: {
      int len;
      char ender;

      regparse--;
      len = int(strcspn(regparse, META));
      if (len <= 0) {
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf("RegularExpression::compile(): Internal error.\n");
        return nullptr;
      }
      ender = *(regparse + len);
      if (len > 1 && ISMULT(ender))
        len--; // Back off clear of ?+* operand.
      *flagp |= HASWIDTH;
      if (len == 1)
        *flagp |= SIMPLE;
      ret = regnode(EXACTLY);
      while (len > 0) {
        regc(*regparse++);
        len--;
      }
      regc('\0');
    } break;
  }
  return (ret);
}